

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpool.h
# Opt level: O0

int strpool_internal_add_block(strpool_t *pool,int size)

{
  int iVar1;
  strpool_internal_block_t *__dest;
  char *pcVar2;
  strpool_internal_block_t *new_blocks;
  int size_local;
  strpool_t *pool_local;
  
  if (pool->block_capacity <= pool->block_count) {
    pool->block_capacity = pool->block_capacity << 1;
    __dest = (strpool_internal_block_t *)
             sx__malloc((sx_alloc *)pool->memctx,(long)pool->block_capacity << 5,0,(char *)0x0,
                        (char *)0x0,0);
    if (__dest == (strpool_internal_block_t *)0x0) {
      __assert_fail("new_blocks",
                    "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                    ,0x216,"int strpool_internal_add_block(strpool_t *, int)");
    }
    memcpy(__dest,pool->blocks,(long)pool->block_count << 5);
    sx__free((sx_alloc *)pool->memctx,pool->blocks,0,(char *)0x0,(char *)0x0,0);
    pool->blocks = __dest;
  }
  pool->blocks[pool->block_count].capacity = size;
  pcVar2 = (char *)sx__malloc((sx_alloc *)pool->memctx,(long)size,0,(char *)0x0,(char *)0x0,0);
  pool->blocks[pool->block_count].data = pcVar2;
  if (pool->blocks[pool->block_count].data != (char *)0x0) {
    pool->blocks[pool->block_count].tail = pool->blocks[pool->block_count].data;
    pool->blocks[pool->block_count].free_list = -1;
    iVar1 = pool->block_count;
    pool->block_count = iVar1 + 1;
    return iVar1;
  }
  __assert_fail("pool->blocks[ pool->block_count ].data",
                "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                ,0x21d,"int strpool_internal_add_block(strpool_t *, int)");
}

Assistant:

static int strpool_internal_add_block( strpool_t* pool, int size )
    {
    if( pool->block_count >= pool->block_capacity ) 
        {
        pool->block_capacity *= 2;
        strpool_internal_block_t* new_blocks = (strpool_internal_block_t*) STRPOOL_MALLOC( pool->memctx, 
            pool->block_capacity * sizeof( *pool->blocks ) );
        STRPOOL_ASSERT( new_blocks );
        STRPOOL_MEMCPY( new_blocks, pool->blocks, pool->block_count * sizeof( *pool->blocks ) );
        STRPOOL_FREE( pool->memctx, pool->blocks );
        pool->blocks = new_blocks;
        }
    pool->blocks[ pool->block_count ].capacity = size;
    pool->blocks[ pool->block_count ].data = (char*) STRPOOL_MALLOC( pool->memctx, (size_t) size );
    STRPOOL_ASSERT( pool->blocks[ pool->block_count ].data );
    pool->blocks[ pool->block_count ].tail = pool->blocks[ pool->block_count ].data;
    pool->blocks[ pool->block_count ].free_list = -1;
    return pool->block_count++;
    }